

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  vector<int,_std::allocator<int>_> *this_00;
  ContextInfo *pCVar2;
  iterator __position;
  iterator __position_00;
  iterator iVar3;
  pointer pPVar4;
  char *pcVar5;
  int i;
  int iVar6;
  deUint32 dVar7;
  deBool dVar8;
  deUint32 dVar9;
  int extraout_EAX;
  int extraout_EAX_00;
  long *plVar10;
  size_t sVar11;
  TextureCube *pTVar12;
  long lVar13;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var14;
  MultiTexShader *this_01;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar15;
  pointer *ppAVar16;
  long *plVar17;
  long lVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  uint *__args;
  uint cellSize;
  int iVar19;
  pointer pAVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  int levelNdx;
  pointer pAVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  Random rnd;
  TextureParameters params;
  GLenum type;
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_2;
  Vector<float,_4> res_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  PixelBufferAccess access;
  deRandom local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  long lStack_460;
  uint local_454;
  ulong local_450;
  pointer *local_448;
  long lStack_440;
  pointer local_438;
  long lStack_430;
  TextureCube *local_428;
  pointer pPStack_420;
  undefined1 local_418 [64];
  ArrayBuffer<unsigned_char,_1UL,_1UL> *local_3d8;
  pointer local_3d0;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_3c8;
  undefined1 local_3b8 [8];
  pointer pAStack_3b0;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_3a8;
  pointer local_398;
  pointer pAStack_390;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_388;
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
  *local_370;
  vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *local_368;
  vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *local_360;
  pointer local_358;
  pointer pPStack_350;
  undefined1 local_348 [16];
  RGBA local_338 [4];
  undefined1 local_328 [8];
  iterator iStack_320;
  pointer local_318 [13];
  ios_base local_2b0 [264];
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  iVar6 = this->m_numUnitsParam;
  if (iVar6 < 1) {
    pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar6 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8872);
  }
  this->m_numUnits = iVar6;
  pTVar12 = (TextureCube *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&local_488,this->m_randSeed);
  fVar26 = deRandom_getFloat(&local_488);
  iVar6 = this->m_numUnits;
  if (0.7 <= fVar26) {
    dVar7 = deRandom_getUint32(&local_488);
    iVar19 = 1;
    if (1 < iVar6 + -2) {
      iVar19 = iVar6 + -2;
    }
    iVar6 = dVar7 % ((iVar6 - iVar19) + 1U) + iVar19;
  }
  this->m_numTextures = iVar6;
  local_328 = (undefined1  [8])pTVar12;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,0x1c11451);
  pAVar15 = (ArrayBuffer<unsigned_char,_1UL,_1UL> *)(plVar10 + 2);
  if ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)*plVar10 == pAVar15) {
    local_3a8.m_ptr = pAVar15->m_ptr;
    local_3a8.m_cap = plVar10[3];
    local_3b8 = (undefined1  [8])&local_3a8;
  }
  else {
    local_3a8.m_ptr = pAVar15->m_ptr;
    local_3b8 = (undefined1  [8])*plVar10;
  }
  pAStack_3b0 = (pointer)plVar10[1];
  *plVar10 = (long)pAVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_3b8);
  ppAVar16 = (pointer *)(plVar10 + 2);
  if ((pointer *)*plVar10 == ppAVar16) {
    local_438 = *ppAVar16;
    lStack_430 = plVar10[3];
    local_448 = &local_438;
  }
  else {
    local_438 = *ppAVar16;
    local_448 = (pointer *)*plVar10;
  }
  lStack_440 = plVar10[1];
  *plVar10 = (long)ppAVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_numTextures);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pAVar21 = (pointer)((long)&local_3d0->m_ptr + lStack_440);
  pAVar20 = (pointer)0xf;
  if (local_448 != &local_438) {
    pAVar20 = local_438;
  }
  if (pAVar20 < pAVar21) {
    pAVar20 = (pointer)0xf;
    if (local_3d8 != &local_3c8) {
      pAVar20 = (pointer)local_3c8.m_ptr;
    }
    if (pAVar21 <= pAVar20) {
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_3d8,0,(char *)0x0,(ulong)local_448);
      goto LAB_00f8419d;
    }
  }
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_448,(ulong)local_3d8);
LAB_00f8419d:
  local_428 = (TextureCube *)local_418;
  pTVar12 = (TextureCube *)(plVar10 + 2);
  if ((TextureCube *)*plVar10 == pTVar12) {
    local_418._0_8_ = ((TextureLevelPyramid *)&pTVar12->m_format)->m_format;
    local_418._8_8_ = plVar10[3];
  }
  else {
    local_418._0_8_ = ((TextureLevelPyramid *)&pTVar12->m_format)->m_format;
    local_428 = (TextureCube *)*plVar10;
  }
  pPStack_420 = (pointer)plVar10[1];
  *plVar10 = (long)pTVar12;
  plVar10[1] = 0;
  *(undefined1 *)&(((TextureLevelPyramid *)&pTVar12->m_format)->m_format).order = R;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_428);
  plVar17 = plVar10 + 2;
  if ((long *)*plVar10 == plVar17) {
    local_468 = *plVar17;
    lStack_460 = plVar10[3];
    local_478 = &local_468;
  }
  else {
    local_468 = *plVar17;
    local_478 = (long *)*plVar10;
  }
  pcVar5 = (char *)local_478;
  uStack_470 = plVar10[1];
  *plVar10 = (long)plVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_478 == (long *)0x0) {
    std::ios::clear((int)(ostringstream *)&iStack_320 +
                    (int)*(undefined8 *)
                          ((((pointer)((long)iStack_320._M_current + -0x28))->
                           super_ConstPixelBufferAccess).m_size.m_data + 2));
  }
  else {
    sVar11 = strlen((char *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_320,pcVar5,sVar11);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  if (local_428 != (TextureCube *)local_418) {
    operator_delete(local_428,local_418._0_8_ + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,(ulong)((long)(void **)local_3c8.m_ptr + 1));
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,(ulong)((long)&local_438->m_ptr + 1));
  }
  if (local_3b8 != (undefined1  [8])&local_3a8) {
    operator_delete((void *)local_3b8,(ulong)((long)(void **)local_3a8.m_ptr + 1));
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,(ulong)((long)(void **)local_388.m_ptr + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_320);
  std::ios_base::~ios_base(local_2b0);
  local_418._48_8_ = &this->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_418._48_8_,
             (long)this->m_numTextures);
  local_370 = (vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
               *)&this->m_textureParams;
  std::
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve((vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
             *)local_370,(long)this->m_numTextures);
  local_418._40_8_ = &this->m_ndx2dOrCube;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_418._40_8_,(long)this->m_numTextures);
  if (0 < this->m_numTextures) {
    local_360 = (vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)&this->m_texturesCube
    ;
    local_368 = (vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&this->m_textures2d;
    local_418._56_8_ = (pointer)0x0;
    do {
      if (this->m_caseType == CASE_ONLY_2D) {
        bVar25 = true;
      }
      else if (this->m_caseType == CASE_ONLY_CUBE) {
        bVar25 = false;
      }
      else {
        dVar8 = deRandom_getBool(&local_488);
        bVar25 = dVar8 == 1;
      }
      local_454 = 0x8513;
      if (bVar25 != false) {
        local_454 = 0xde1;
      }
      dVar7 = deRandom_getUint32(&local_488);
      uStack_470._0_4_ = *(GLenum *)(s_testWrapModes + (ulong)(dVar7 % 3) * 4);
      dVar7 = deRandom_getUint32(&local_488);
      uStack_470 = CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar7 % 3) * 4),
                            (GLenum)uStack_470);
      dVar7 = deRandom_getUint32(&local_488);
      local_468._4_4_ = (&deqp::gles3::Functional::s_testNonMipmapMinFilters)[dVar7 & 1];
      dVar7 = deRandom_getUint32(&local_488);
      local_478._4_4_ = *(GLenum *)(s_testDataTypes + (ulong)(dVar7 & 3) * 4);
      dVar7 = deRandom_getUint32(&local_488);
      local_468 = CONCAT44(local_468._4_4_,
                           *(undefined4 *)(s_testMinFilters + (ulong)(dVar7 % 6) * 4));
      if (local_478._4_4_ == 0x8363) {
        local_478 = (long *)0x836300001907;
      }
      else if (local_478._4_4_ - 0x8033 < 2) {
        local_478 = (long *)CONCAT44(local_478._4_4_,0x1908);
      }
      else {
        dVar7 = deRandom_getUint32(&local_488);
        local_478 = (long *)CONCAT44(local_478._4_4_,
                                     *(undefined4 *)(s_testFormats + (ulong)(dVar7 % 5) * 4));
      }
      __position._M_current =
           (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_418._48_8_,__position,
                   &local_454);
      }
      else {
        *__position._M_current = local_454;
        (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (this->m_textureParams).
           super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_textureParams).
          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
        ::_M_realloc_insert<deqp::gles2::Functional::TextureUnitCase::TextureParameters_const&>
                  (local_370,__position_00,(TextureParameters *)&local_478);
      }
      else {
        (__position_00._M_current)->minFilter = (GLenum)local_468;
        (__position_00._M_current)->magFilter = local_468._4_4_;
        *(long **)__position_00._M_current = local_478;
        (__position_00._M_current)->wrapModeS = (GLenum)uStack_470;
        (__position_00._M_current)->wrapModeT = uStack_470._4_4_;
        ppTVar1 = &(this->m_textureParams).
                   super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      uVar22 = (uint)(bVar25 ^ 1) * 0x80 + 0x80;
      if (bVar25 == false) {
        local_328._0_4_ =
             (undefined4)
             ((ulong)((long)(this->m_texturesCube).
                            super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_texturesCube).
                           super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar3._M_current =
             (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_418._40_8_,iVar3,(int *)local_328);
        }
        else {
          *iVar3._M_current = local_328._0_4_;
          (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pTVar12 = (TextureCube *)operator_new(0x168);
        local_1a8[0].super_ConstPixelBufferAccess.m_format =
             glu::mapGLTransferFormat((GLenum)local_478,local_478._4_4_);
        tcu::TextureCube::TextureCube(pTVar12,(TextureFormat *)local_1a8,uVar22);
        local_328 = (undefined1  [8])pTVar12;
        std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
        emplace_back<tcu::TextureCube*>(local_360,(TextureCube **)local_328);
        lVar13 = 0xe0;
      }
      else {
        local_328._0_4_ =
             (undefined4)
             ((ulong)((long)(this->m_textures2d).
                            super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_textures2d).
                           super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar3._M_current =
             (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_418._40_8_,iVar3,(int *)local_328);
        }
        else {
          *iVar3._M_current = local_328._0_4_;
          (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pTVar12 = (TextureCube *)operator_new(0x50);
        local_1a8[0].super_ConstPixelBufferAccess.m_format =
             glu::mapGLTransferFormat((GLenum)local_478,local_478._4_4_);
        tcu::Texture2D::Texture2D((Texture2D *)pTVar12,(TextureFormat *)local_1a8,uVar22,uVar22);
        local_328 = (undefined1  [8])pTVar12;
        std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                  (local_368,(Texture2D **)local_328);
        lVar13 = 200;
      }
      tcu::getTextureFormatInfo
                ((TextureFormatInfo *)local_328,
                 *(TextureFormat **)
                  (*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                    _vptr_TestNode + lVar13) + -8));
      iVar6 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      local_428 = (TextureCube *)local_328;
      pPStack_420 = (pointer)iStack_320._M_current;
      local_448 = (pointer *)0x0;
      lStack_440 = 0;
      lVar13 = 0;
      do {
        *(float *)((long)&local_448 + lVar13 * 4) =
             *(float *)((long)local_318 + lVar13 * 4) - *(float *)(local_328 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      local_418._24_8_ = ZEXT48(iVar6 + 1);
      local_450 = 0;
      do {
        dVar7 = deRandom_getUint32(&local_488);
        uVar23 = 0xff000000;
        uVar22 = 0xff000000;
        if ((GLenum)local_478 == 0x1906) {
          dVar9 = deRandom_getUint32(&local_488);
          uVar23 = dVar9 & 0xff000000;
          uVar22 = ~uVar23;
        }
        lVar13 = 0;
        pAVar21 = (pointer)0x0;
        do {
          if (bVar25 == false) {
            tcu::TextureCube::allocLevel
                      ((this->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],(CubeFace)local_450,
                       (int)pAVar21);
          }
          else {
            tcu::Texture2D::allocLevel
                      ((this->m_textures2d).
                       super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],(int)pAVar21);
          }
          cellSize = 8 >> ((byte)pAVar21 & 0x1f);
          if ((int)cellSize < 2) {
            cellSize = 1;
          }
          if (bVar25 == false) {
            p_Var14 = &(this->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]->m_access[local_450].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          else {
            p_Var14 = &((this->m_textures2d).
                        super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]->super_TextureLevelPyramid).
                       m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          pPVar4 = (((_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      *)&p_Var14->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
          local_1a8[0].super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)(pPVar4 + (long)pAVar21);
          lVar18 = 2;
          do {
            local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[lVar18 + -2] =
                 *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar18 * 4 + lVar13 + -8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          lVar18 = 5;
          do {
            local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[lVar18 + -2] =
                 *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar18 * 4 + lVar13 + -8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 8);
          local_1a8[0].super_ConstPixelBufferAccess.m_data =
               *(void **)((TextureFormat *)(pPVar4 + (long)pAVar21) + 4);
          local_418._36_4_ = uVar23 | dVar7 & 0xffffff;
          tcu::RGBA::toVec((RGBA *)&local_3d8);
          local_398 = (ArrayBuffer<unsigned_char,_1UL,_1UL> *)0x0;
          pAStack_390 = (pointer)0x0;
          lVar18 = 0;
          do {
            *(float *)((long)&local_398 + lVar18 * 4) =
                 *(float *)((long)&local_3d8 + lVar18 * 4) *
                 *(float *)((long)&local_448 + lVar18 * 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          local_3b8 = (undefined1  [8])0x0;
          pAStack_3b0 = (pointer)0x0;
          lVar18 = 0;
          do {
            *(float *)(local_3b8 + lVar18 * 4) =
                 *(float *)((long)&local_398 + lVar18 * 4) +
                 *(float *)((long)&local_428 + lVar18 * 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          local_418._32_4_ = ~(dVar7 & 0xffffff) | uVar22;
          tcu::RGBA::toVec(local_338);
          local_358 = (pointer)0x0;
          pPStack_350 = (pointer)0x0;
          lVar18 = 0;
          do {
            *(float *)((long)&local_358 + lVar18 * 4) =
                 (float)local_338[lVar18].m_value * *(float *)((long)&local_448 + lVar18 * 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ = (pointer)0x0;
          lVar18 = 0;
          do {
            *(float *)(local_348 + lVar18 * 4) =
                 *(float *)((long)&local_358 + lVar18 * 4) +
                 *(float *)((long)&local_428 + lVar18 * 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          tcu::fillWithGrid(local_1a8,cellSize,(Vec4 *)local_3b8,(Vec4 *)local_348);
          pAVar21 = (pointer)((long)&pAVar21->m_ptr + 1);
          lVar13 = lVar13 + 0x28;
        } while (pAVar21 != (pointer)local_418._24_8_);
        bVar24 = local_450 < 5;
        local_450 = local_450 + 1;
      } while (bVar24 && bVar25 == false);
      uVar22 = (int)local_418._56_8_ + 1;
      local_418._56_8_ = ZEXT48(uVar22);
    } while ((int)uVar22 < this->m_numTextures);
  }
  this_00 = &this->m_unitTextures;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)this->m_numUnits);
  local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffff00000000);
  if (0 < this->m_numTextures) {
    iVar6 = 0;
    do {
      iVar3._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar3,(int *)local_328);
      }
      else {
        *iVar3._M_current = iVar6;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      iVar6 = local_328._0_4_ + 1;
      local_328._0_4_ = iVar6;
    } while (iVar6 < this->m_numTextures);
  }
  last._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  first._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits) {
    do {
      uVar22 = this->m_numTextures;
      dVar7 = deRandom_getUint32(&local_488);
      uVar22 = dVar7 % uVar22;
      local_328._0_4_ = uVar22;
      iVar3._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,iVar3,(int *)local_328);
      }
      else {
        *iVar3._M_current = uVar22;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      last._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      first._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    } while ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits)
    ;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_488,first,last);
  local_328 = (undefined1  [8])0x0;
  iStack_320._M_current = (uint *)0x0;
  local_318[0] = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,(long)this->m_numUnits
            );
  if (0 < this->m_numUnits) {
    lVar13 = 0;
    do {
      __args = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_418._48_8_)->
               _M_impl).super__Vector_impl_data._M_start +
               (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar13];
      if ((pointer)iStack_320._M_current == local_318[0]) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_328,iStack_320,__args)
        ;
      }
      else {
        *iStack_320._M_current = *__args;
        iStack_320._M_current = iStack_320._M_current + 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->m_numUnits);
  }
  this_01 = (MultiTexShader *)operator_new(0x1a0);
  dVar7 = deRandom_getUint32(&local_488);
  MultiTexShader::MultiTexShader
            (this_01,dVar7,this->m_numUnits,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328);
  this->m_shader = this_01;
  iVar6 = extraout_EAX;
  if (local_328 != (undefined1  [8])0x0) {
    operator_delete((void *)local_328,(long)local_318[0] - (long)local_328);
    iVar6 = extraout_EAX_00;
  }
  return iVar6;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndx2dOrCube.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types (2d or cube), and randomized parameters for every texture.

			TextureParameters	params;
			bool				is2d		= m_caseType == CASE_ONLY_2D	? true :
											  m_caseType == CASE_ONLY_CUBE	? false :
																			  rnd.getBool();

			GLenum				type		= is2d ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
			const int			texWidth	= is2d ? TEXTURE_WIDTH_2D : TEXTURE_WIDTH_CUBE;
			const int			texHeight	= is2d ? TEXTURE_HEIGHT_2D : TEXTURE_HEIGHT_CUBE;
			bool				mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
			int					numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;

			params.wrapModeS	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.magFilter	= s_testMagFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)];
			params.dataType		= s_testDataTypes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes) - 1)];

			// Certain minification filters are only used when using mipmaps.
			if (mipmaps)
				params.minFilter = s_testMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)];
			else
				params.minFilter = s_testNonMipmapMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)];

			// Format may depend on data type.
			if (params.dataType == GL_UNSIGNED_SHORT_5_6_5)
				params.format = GL_RGB;
			else if (params.dataType == GL_UNSIGNED_SHORT_4_4_4_4 || params.dataType == GL_UNSIGNED_SHORT_5_5_5_1)
				params.format = GL_RGBA;
			else
				params.format = s_testFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testFormats) - 1)];

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			if (is2d)
			{
				m_ndx2dOrCube.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d array.
				m_textures2d.push_back(new tcu::Texture2D(glu::mapGLTransferFormat(params.format, params.dataType), texWidth, texHeight));
			}
			else
			{
				m_ndx2dOrCube.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube array.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(glu::mapGLTransferFormat(params.format, params.dataType), texWidth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(is2d ? m_textures2d.back()->getFormat() : m_texturesCube.back()->getFormat());
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = is2d ? 1 : (int)tcu::CUBEFACE_LAST;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha0	= 0xff000000;
				deUint32 alpha1	= 0xff000000;

				if (params.format == GL_ALPHA) // \note This needs alpha to be visible.
				{
					alpha0 &= rnd.getUint32();
					alpha1 = ~alpha0;
				}

				deUint32 colorA = alpha0 | rgb;
				deUint32 colorB = alpha1 | ~rgb;

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2d)
						m_textures2d.back()->allocLevel(levelNdx);
					else
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2d ? m_textures2d.back()->getLevel(levelNdx) : m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face);
					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Create shader.

		vector<GLenum> unitTypes;
		unitTypes.reserve(m_numUnits);
		for (int i = 0; i < m_numUnits; i++)
			unitTypes.push_back(m_textureTypes[m_unitTextures[i]]);

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}